

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_9::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  char *start;
  bool bVar1;
  int osErrorNumber;
  size_t sVar2;
  void *pvVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  DiskHandle *local_c0;
  uchar *local_b8;
  Fault local_b0;
  Fault f_1;
  long *local_a0;
  undefined1 local_98 [8];
  DebugComparison<long_&,_int> _kjCondition;
  Fault local_60;
  Fault f;
  SyscallResult local_34;
  undefined1 auStack_30 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  uint64_t offset_local;
  DiskHandle *this_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  this_local = (DiskHandle *)__buf;
  data_local.ptr = (uchar *)__n;
  while( true ) {
    sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    if (sVar2 == 0) {
      return 0;
    }
    f.exception = (Exception *)auStack_30;
    local_34 = kj::_::Debug::
               syscall<kj::(anonymous_namespace)::DiskHandle::write(unsigned_long,kj::ArrayPtr<unsigned_char_const>)const::_lambda()_1_>
                         ((anon_class_32_4_7cf98988 *)&f,false);
    pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_34);
    if (pvVar3 == (void *)0x0) break;
    local_a0 = (long *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_30);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<long&>::operator>
              ((DebugComparison<long_&,_int> *)local_98,(DebugExpression<long&> *)&local_a0,
               (int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    start = _auStack_30;
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                (&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x187,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",
                 (DebugComparison<long_&,_int> *)local_98,(char (*) [24])"pwrite() returned zero?");
      kj::_::Debug::Fault::fatal(&local_b0);
    }
    sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    AVar4 = ArrayPtr<const_unsigned_char>::slice
                      ((ArrayPtr<const_unsigned_char> *)&this_local,(size_t)start,sVar2);
    local_c0 = (DiskHandle *)AVar4.ptr;
    this_local = local_c0;
    local_b8 = (uchar *)AVar4.size_;
    data_local.ptr = local_b8;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_34);
  kj::_::Debug::Fault::Fault
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x186,osErrorNumber,"n = pwrite(fd, data.begin(), data.size(), offset)","");
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }